

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O3

int hydro_hash_final(hydro_hash_state *state,uint8_t *out,size_t out_len)

{
  byte *pbVar1;
  undefined8 uVar2;
  int iVar3;
  uchar *src;
  uint8_t *puVar4;
  uchar *dst;
  ulong uVar5;
  uint8_t lc [4];
  char local_2c;
  undefined1 local_2b;
  undefined1 local_2a;
  undefined1 local_29;
  
  iVar3 = -1;
  if (0xffffffffffff000f < out_len - 0x10000) {
    local_2b = (undefined1)out_len;
    local_2a = (undefined1)(out_len >> 8);
    local_29 = 0;
    local_2c = (0xff < out_len) + '\x01';
    hydro_hash_update(state,&local_2c,(ulong)(0xff < out_len) + 3);
    uVar5 = out_len >> 4;
    pbVar1 = (byte *)((long)state->state + (ulong)state->buf_off);
    *pbVar1 = *pbVar1 ^ 0x1f;
    pbVar1 = (byte *)((long)state->state + 0xf);
    *pbVar1 = *pbVar1 ^ 0x80;
    puVar4 = out;
    do {
      gimli_core_u8((uint8_t *)state,'\0');
      uVar2 = *(undefined8 *)(state->state + 2);
      *(undefined8 *)puVar4 = *(undefined8 *)state->state;
      *(undefined8 *)(puVar4 + 8) = uVar2;
      puVar4 = puVar4 + 0x10;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
    if ((out_len & 0xf) != 0) {
      gimli_core_u8((uint8_t *)state,'\0');
      memcpy(out + ((uint)out_len & 0xfff0),state,out_len & 0xf);
    }
    iVar3 = 0;
    state->buf_off = '\x10';
  }
  return iVar3;
}

Assistant:

int
hydro_hash_final(hydro_hash_state *state, uint8_t *out, size_t out_len)
{
    uint8_t  lc[4];
    uint8_t *buf = (uint8_t *) (void *) state->state;
    size_t   i;
    size_t   lc_len;
    size_t   leftover;

    if (out_len < hydro_hash_BYTES_MIN || out_len > hydro_hash_BYTES_MAX) {
        return -1;
    }
    COMPILER_ASSERT(hydro_hash_BYTES_MAX <= 0xffff);
    lc[1]  = (uint8_t) out_len;
    lc[2]  = (uint8_t) (out_len >> 8);
    lc[3]  = 0;
    lc_len = (size_t) (1 + (lc[2] != 0));
    lc[0]  = (uint8_t) lc_len;
    hydro_hash_update(state, lc, 1 + lc_len + 1);
    gimli_pad_u8(buf, state->buf_off, gimli_DOMAIN_XOF);
    for (i = 0; i < out_len / gimli_RATE; i++) {
        gimli_core_u8(buf, 0);
        memcpy(out + i * gimli_RATE, buf, gimli_RATE);
    }
    leftover = out_len % gimli_RATE;
    if (leftover != 0) {
        gimli_core_u8(buf, 0);
        mem_cpy(out + i * gimli_RATE, buf, leftover);
    }
    state->buf_off = gimli_RATE;

    return 0;
}